

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::CommandQueueVkImpl::~CommandQueueVkImpl(CommandQueueVkImpl *this)

{
  void *in_RSI;
  CommandQueueVkImpl *this_local;
  
  ~CommandQueueVkImpl(this);
  RefCountedObject<Diligent::ICommandQueueVk>::operator_delete
            ((RefCountedObject<Diligent::ICommandQueueVk> *)this,in_RSI);
  return;
}

Assistant:

CommandQueueVkImpl::~CommandQueueVkImpl()
{
    // Fence have resources that will be added to release queue.
    // But release queue will be destroyed after command queue and it will not release new resources.
    if (m_pFence)
        m_pFence->ImmediatelyReleaseResources();

    m_pFence.Release();
    m_LastSyncPoint.reset();

    // Queues are created along with the logical device during vkCreateDevice.
    // All queues associated with the logical device are destroyed when vkDestroyDevice
    // is called on that device.
}